

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralSelector.cpp
# Opt level: O0

int __thiscall
Kernel::LiteralSelector::select
          (LiteralSelector *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds
          ,timeval *__timeout)

{
  bool bVar1;
  int extraout_EAX;
  int iVar2;
  int extraout_EAX_00;
  Literal **ppLVar3;
  undefined4 in_register_00000034;
  Clause *this_00;
  int priority;
  uint i;
  bool modified;
  int maxPriority;
  uint eligible;
  uint in_stack_ffffffffffffffbc;
  Clause *in_stack_ffffffffffffffc0;
  LiteralSelector *in_stack_ffffffffffffffc8;
  uint local_24;
  int local_1c;
  uint local_18;
  uint local_14;
  
  this_00 = (Clause *)CONCAT44(in_register_00000034,__nfds);
  local_14 = (uint)__readfds;
  if (local_14 == 0) {
    local_14 = Clause::length(this_00);
  }
  if (local_14 < 2) {
    Clause::setSelected(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    iVar2 = extraout_EAX;
  }
  else {
    local_18 = 1;
    Clause::operator[](this_00,0);
    local_1c = getSelectionPriority(in_stack_ffffffffffffffc8,(Literal *)in_stack_ffffffffffffffc0);
    bVar1 = false;
    for (local_24 = 1; local_24 < local_14; local_24 = local_24 + 1) {
      Clause::operator[](this_00,local_24);
      iVar2 = getSelectionPriority(in_stack_ffffffffffffffc8,(Literal *)in_stack_ffffffffffffffc0);
      if (iVar2 == local_1c) {
        if (local_18 != local_24) {
          in_stack_ffffffffffffffc8 = (LiteralSelector *)Clause::operator[](this_00,local_24);
          ppLVar3 = Clause::operator[](this_00,local_18);
          std::swap<Kernel::Literal*>((Literal **)in_stack_ffffffffffffffc8,ppLVar3);
          bVar1 = true;
        }
        local_18 = local_18 + 1;
      }
      else if (local_1c < iVar2) {
        local_18 = 1;
        in_stack_ffffffffffffffc0 = (Clause *)Clause::operator[](this_00,local_24);
        ppLVar3 = Clause::operator[](this_00,0);
        std::swap<Kernel::Literal*>((Literal **)in_stack_ffffffffffffffc0,ppLVar3);
        bVar1 = true;
        local_1c = iVar2;
      }
    }
    if (bVar1) {
      Clause::notifyLiteralReorder(in_stack_ffffffffffffffc0);
    }
    if (local_18 == 1) {
      Clause::setSelected(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      iVar2 = extraout_EAX_00;
    }
    else {
      iVar2 = (*this->_vptr_LiteralSelector[4])(this,this_00,(ulong)local_18);
    }
  }
  return iVar2;
}

Assistant:

void LiteralSelector::select(Clause* c, unsigned eligibleInp)
{
  ASS_LE(eligibleInp, c->length());

  if(eligibleInp==0) {
    eligibleInp = c->length();
  }

  if(eligibleInp<=1) {
    c->setSelected(eligibleInp);
    return;
  }

  unsigned eligible=1;
  { /* we order the clause so that the literals with highest `getSelectionPriority` are in the front, and eligible is the number of literals with that selection priority */ 
    int maxPriority=getSelectionPriority((*c)[0]);
    bool modified=false;

    for (unsigned i = 1; i < eligibleInp; i++) {
      int priority = getSelectionPriority((*c)[i]);
      if (priority == maxPriority) {
        if (eligible != i) {
          swap((*c)[i], (*c)[eligible]);
          modified = true;
        }
        eligible++;
      } else if (priority > maxPriority) {
        maxPriority = priority;
        eligible = 1;
        swap((*c)[i], (*c)[0]);
        modified = true;
      }
    }
    ASS_LE(eligible,eligibleInp);
    if(modified) {
      c->notifyLiteralReorder();
    }
  }

  if(eligible==1) {
    c->setSelected(eligible);
    return;
  }

  ASS_G(eligible,1);
  doSelection(c, eligible);
}